

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key_components.c
# Opt level: O1

void key_components_add_copy(key_components *kc,char *name,key_component *value)

{
  KeyComponentType type;
  ptrlen data;
  
  type = value->type;
  if (type < KCT_MPINT) {
    data.ptr = ((value->field_2).str)->u;
    data.len = ((value->field_2).str)->len;
    key_components_add_str(kc,name,type,data);
    return;
  }
  if (type == KCT_MPINT) {
    key_components_add_mp(kc,name,(value->field_2).mp);
    return;
  }
  return;
}

Assistant:

void key_components_add_copy(key_components *kc,
                             const char *name, const key_component *value)
{
    switch (value->type) {
      case KCT_TEXT:
      case KCT_BINARY:
        key_components_add_str(kc, name, value->type,
                               ptrlen_from_strbuf(value->str));
        break;
      case KCT_MPINT:
        key_components_add_mp(kc, name, value->mp);
        break;
    }
}